

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macierz.c
# Opt level: O1

int main(void)

{
  double dVar1;
  undefined8 __ptr;
  void *__ptr_00;
  int *piVar2;
  runnable_t *prVar3;
  size_t __nmemb;
  ulong uVar4;
  long lVar5;
  undefined1 local_c8 [8];
  thread_pool_t pool;
  uint local_38;
  int local_34;
  int columns;
  int rows;
  
  pthread_mutex_init((pthread_mutex_t *)&guard,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&cond,(pthread_condattr_t *)0x0);
  __isoc99_scanf("%d",&local_34);
  __isoc99_scanf("%d",&local_38);
  thread_pool_init((thread_pool_t *)local_c8,4);
  __nmemb = (size_t)local_34;
  row_sum = (int *)calloc(__nmemb,4);
  lVar5 = (long)(int)local_38 * __nmemb;
  pool.threads_idle.__data.__g_signals = (uint  [2])malloc(lVar5 * 8);
  __ptr_00 = malloc(lVar5 * 0x18);
  uVar4 = (ulong)local_38;
  if (0 < (int)(local_34 * local_38)) {
    lVar5 = 0;
    do {
      piVar2 = (int *)malloc(0xc);
      dVar1 = floor((double)(int)lVar5 / (double)(int)uVar4);
      *piVar2 = (int)dVar1;
      __isoc99_scanf("%d",piVar2 + 1);
      __isoc99_scanf("%d",piVar2 + 2);
      *(int **)((long)pool.threads_idle.__data.__g_signals + lVar5 * 8) = piVar2;
      prVar3 = (runnable_t *)malloc(0x18);
      prVar3->function = runnable_function;
      prVar3->arg = piVar2;
      prVar3->argsz = 0xc;
      *(runnable_t **)((long)__ptr_00 + lVar5 * 8) = prVar3;
      defer((thread_pool_t *)local_c8,*prVar3);
      lVar5 = lVar5 + 1;
      uVar4 = (ulong)(int)local_38;
    } while (lVar5 < (long)((long)local_34 * uVar4));
  }
  __ptr = pool.threads_idle.__data.__g_signals;
  pthread_mutex_lock((pthread_mutex_t *)&guard);
  if (count != local_38 * local_34) {
    do {
      pthread_cond_wait((pthread_cond_t *)&cond,(pthread_mutex_t *)&guard);
    } while (count != local_38 * local_34);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&guard);
  thread_pool_destroy((thread_pool_t *)local_c8);
  if (0 < local_34) {
    lVar5 = 0;
    do {
      printf("%d\n",(ulong)(uint)row_sum[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_34);
  }
  if (0 < (int)(local_38 * local_34)) {
    lVar5 = 0;
    do {
      free(*(void **)(__ptr + lVar5 * 8));
      free(*(void **)((long)__ptr_00 + lVar5 * 8));
      lVar5 = lVar5 + 1;
    } while (lVar5 < (long)(int)local_38 * (long)local_34);
  }
  free((void *)__ptr);
  free(__ptr_00);
  free(row_sum);
  return 0;
}

Assistant:

int main() {
    pthread_mutex_init(&guard, 0);
    pthread_cond_init(&cond, 0);

    int rows, columns;
    scanf("%d", &rows);
    scanf("%d", &columns);

    thread_pool_t pool;
    thread_pool_init(&pool, NO_THREADS);

    row_sum = calloc(rows, sizeof(int));

    my_job **jobArray = malloc(rows * columns * sizeof(my_job *));
    runnable_t **runArray = malloc(rows * columns * sizeof(runnable_t));
    for (int i = 0; i < rows * columns; ++i) {
        /* Creating Job */
        my_job *new_my_job = malloc(sizeof(my_job));

        new_my_job->row = floor((double) i / (double) columns);

        scanf("%d", &new_my_job->val);
        scanf("%d", &new_my_job->sleep_time);

        jobArray[i] = new_my_job;

        /* Creating Runnable */
        runnable_t *new_runnable = malloc(sizeof(runnable_t));

        new_runnable->function = runnable_function;
        new_runnable->arg = new_my_job;
        new_runnable->argsz = sizeof(my_job);

        runArray[i] = new_runnable;

        /* Submit task to the thread pool */
        defer(&pool, *new_runnable);
    }

    pthread_mutex_lock(&guard);
    while (count != rows * columns) {
        pthread_cond_wait(&cond, &guard);
    }
    pthread_mutex_unlock(&guard);

    thread_pool_destroy(&pool);

    for (int i = 0; i < rows; ++i) {
        printf("%d\n", row_sum[i]);
    }

    for (int i = 0; i < rows * columns; ++i) {
        free(jobArray[i]);
        free(runArray[i]);
    }

    free(jobArray);
    free(runArray);
    free(row_sum);

    return 0;
}